

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O3

unsigned_long ndiGetPSTATCurrentTest(ndicapi *pol,int port)

{
  char cVar1;
  ulong uVar2;
  char (*pacVar3) [8];
  int i;
  long lVar4;
  int iVar5;
  
  if (port - 0x31U < 3) {
    pacVar3 = pol->PstatTesting + (port - 0x31U);
  }
  else {
    if (8 < port - 0x41U) {
      return 0;
    }
    pacVar3 = pol->PstatPassiveTesting + (port - 0x41U);
  }
  if ((*pacVar3)[0] == '\0') {
    return 0;
  }
  lVar4 = 0;
  uVar2 = 0;
  while( true ) {
    cVar1 = (*pacVar3)[lVar4];
    iVar5 = -0x57;
    if (((5 < (byte)(cVar1 + 0x9fU)) && (iVar5 = -0x37, 5 < (byte)(cVar1 + 0xbfU))) &&
       (iVar5 = -0x30, 9 < (byte)(cVar1 - 0x30U))) break;
    uVar2 = uVar2 << 4 | (ulong)(uint)(iVar5 + cVar1);
    lVar4 = lVar4 + 1;
    if (lVar4 == 8) {
      return uVar2;
    }
  }
  return uVar2;
}

Assistant:

ndicapiExport unsigned long ndiGetPSTATCurrentTest(ndicapi* pol, int port)
{
  char* dp;

  if (port >= '1' && port <= '3')
  {
    dp = pol->PstatTesting[port - '1'];
  }
  else if (port >= 'A' && port <= 'I')
  {
    dp = pol->PstatPassiveTesting[port - 'A'];
  }
  else
  {
    return 0;
  }

  if (*dp == '\0')
  {
    return 0;
  }

  return (unsigned long)ndiHexToUnsignedLong(dp, 8);
}